

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.cpp
# Opt level: O2

BumpAllocator * __thiscall slang::BumpAllocator::operator=(BumpAllocator *this,BumpAllocator *other)

{
  Segment *pSVar1;
  byte *pbVar2;
  
  if (this != other) {
    ~BumpAllocator(this);
    pSVar1 = other->head;
    pbVar2 = other->endPtr;
    other->head = (Segment *)0x0;
    this->head = pSVar1;
    this->endPtr = pbVar2;
  }
  return this;
}

Assistant:

BumpAllocator& BumpAllocator::operator=(BumpAllocator&& other) noexcept {
    if (this != &other) {
        this->~BumpAllocator();
        new (this) BumpAllocator(std::move(other));
    }
    return *this;
}